

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

Totals * __thiscall
Catch::anon_unknown_26::TestGroup::execute(Totals *__return_storage_ptr__,TestGroup *this)

{
  _Rb_tree_header *p_Var1;
  Totals *pTVar2;
  ulong uVar3;
  pointer pFVar4;
  int iVar5;
  Totals *in_RAX;
  undefined4 extraout_var;
  FilterMatch *match;
  pointer pFVar6;
  Totals local_70;
  
  (__return_storage_ptr__->testCases).failedButOk = 0;
  (__return_storage_ptr__->testCases).skipped = 0;
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->assertions).failedButOk = 0;
  (__return_storage_ptr__->assertions).skipped = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  pTVar2 = (Totals *)(this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_tests)._M_t._M_impl.super__Rb_tree_header;
  if (pTVar2 != (Totals *)p_Var1) {
    in_RAX = pTVar2;
    do {
      uVar3 = (this->m_context).m_totals.assertions.failed;
      iVar5 = (*((this->m_context).m_config)->_vptr_IConfig[9])();
      if (uVar3 < (ulong)(long)iVar5) {
        RunContext::runTest(&local_70,&this->m_context,(TestCaseHandle *)(in_RAX->testCases).passed)
        ;
        Totals::operator+=(__return_storage_ptr__,&local_70);
      }
      else {
        (*this->m_reporter->_vptr_IEventListener[0x12])
                  (this->m_reporter,*(undefined8 *)(in_RAX->testCases).passed);
      }
      in_RAX = (Totals *)std::_Rb_tree_increment((_Rb_tree_node_base *)in_RAX);
    } while (in_RAX != (Totals *)p_Var1);
  }
  pFVar4 = (this->m_matches).
           super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar6 = (this->m_matches).
                super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar6 != pFVar4; pFVar6 = pFVar6 + 1) {
    in_RAX = (Totals *)
             (pFVar6->tests).
             super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (in_RAX == (Totals *)
                  (pFVar6->tests).
                  super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      this->m_unmatchedTestSpecs = true;
      iVar5 = (*this->m_reporter->_vptr_IEventListener[2])
                        (this->m_reporter,(pFVar6->name)._M_dataplus._M_p,
                         (pFVar6->name)._M_string_length);
      in_RAX = (Totals *)CONCAT44(extraout_var,iVar5);
    }
  }
  return in_RAX;
}

Assistant:

Totals execute() {
                Totals totals;
                for (auto const& testCase : m_tests) {
                    if (!m_context.aborting())
                        totals += m_context.runTest(*testCase);
                    else
                        m_reporter->skipTest(testCase->getTestCaseInfo());
                }

                for (auto const& match : m_matches) {
                    if (match.tests.empty()) {
                        m_unmatchedTestSpecs = true;
                        m_reporter->noMatchingTestCases( match.name );
                    }
                }

                return totals;
            }